

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf-test.cpp
# Opt level: O1

void u8_to_U_test(int line,UTF_S8 *str1,UTF_US32 *str2,bool ok)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  byte *pbVar4;
  char32_t *pcVar5;
  char32_t cVar6;
  long lVar7;
  byte *pbVar8;
  undefined1 *puVar9;
  undefined4 *puVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  UTF_UC8 uc8 [4];
  UTF_US32 tmp;
  UTF_UC32 buf [256];
  undefined1 local_458 [4];
  undefined1 local_454 [8];
  byte local_44c [4];
  UTF_US32 local_448;
  char32_t local_428 [256];
  
  puVar9 = local_458;
  local_448._M_string_length = 0;
  local_448.field_2._M_local_buf[0] = L'\0';
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  bVar2 = UTF_u8_to_U<(char)63>((UTF_US8 *)str1,&local_448);
  UTF_test(line,bVar2 == ok);
  iVar3 = std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::compare
                    (&local_448,str2);
  UTF_test(line,iVar3 == 0);
  if (str1->_M_string_length == 0) goto LAB_00101a3f;
  pbVar8 = (byte *)(str1->_M_dataplus)._M_p;
  pbVar4 = pbVar8 + str1->_M_string_length;
  lVar11 = 0;
  while( true ) {
    lVar7 = lVar11;
    bVar1 = *pbVar8;
    uVar12 = 1;
    if ((((char)bVar1 < '\0') && (uVar12 = 2, 0x1d < (byte)(bVar1 + 0x3e))) &&
       (uVar12 = 3, (bVar1 & 0xf0) != 0xe0)) {
      uVar12 = (uint)((bVar1 & 0xf8) == 0xf0) << 2;
    }
    puVar10 = (undefined4 *)((long)local_428 + lVar7);
    if (uVar12 != 0) break;
    if (lVar7 == 0x3fc) goto LAB_00101a54;
    *(undefined4 *)((long)local_428 + lVar7) = 0x3f;
    pbVar8 = pbVar8 + 1;
    lVar11 = lVar7 + 4;
    if (pbVar8 == pbVar4) goto code_r0x00101a16;
  }
  if (uVar12 == 1) goto LAB_001018b3;
  uVar13 = 1;
  while (pbVar8 = pbVar8 + 1, pbVar8 != pbVar4) {
    local_44c[uVar13] = *pbVar8;
    uVar13 = uVar13 + 1;
    if (uVar12 == uVar13) {
LAB_001018b3:
      uVar12 = 1;
      if ((((char)bVar1 < '\0') && (uVar12 = 2, 0x1d < (byte)(bVar1 + 0x3e))) &&
         (uVar12 = 3, (bVar1 & 0xf0) != 0xe0)) {
        uVar12 = (uint)((bVar1 & 0xf8) == 0xf0) << 2;
      }
      (*(code *)(&DAT_00106018 + *(int *)(&DAT_00106018 + (ulong)uVar12 * 4)))
                (puVar10,&DAT_00106018,pbVar8);
      return;
    }
  }
  local_44c[0] = bVar1;
  if (lVar7 == 0x3fc) {
LAB_00101a54:
    bVar2 = false;
    goto LAB_00101a56;
  }
  *puVar10 = 0x3f;
  puVar10 = (undefined4 *)((long)local_428 + lVar7 + 4);
  goto LAB_00101a44;
code_r0x00101a16:
  puVar9 = local_454 + lVar7;
LAB_00101a3f:
  puVar10 = (undefined4 *)(puVar9 + 0x30);
LAB_00101a44:
  bVar2 = true;
LAB_00101a56:
  *puVar10 = 0;
  UTF_test(line,bVar2);
  cVar6 = *local_448._M_dataplus._M_p;
  if (cVar6 == L'\0') {
    pcVar5 = local_428;
  }
  else {
    pcVar5 = local_428;
    lVar11 = 0;
    while (*pcVar5 != L'\0') {
      bVar2 = local_448._M_string_length + 1 == lVar11;
      if ((cVar6 != *pcVar5) || (local_448._M_string_length + 1 == lVar11)) goto LAB_00101ab5;
      pcVar5 = pcVar5 + 1;
      cVar6 = local_448._M_dataplus._M_p[lVar11 + 1];
      lVar11 = lVar11 + 1;
      if (cVar6 == L'\0') break;
    }
  }
  bVar2 = cVar6 == *pcVar5;
LAB_00101ab5:
  UTF_test(line,bVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p);
  }
  return;
}

Assistant:

void u8_to_U_test(int line, const UTF_S8& str1, const UTF_US32& str2, bool ok)
{
    UTF_US32 tmp;
    UTF_UC32 buf[256];
    UTF_test(line, UTF_u8_to_U<'?'>(str1, tmp) == ok);
    UTF_test(line, tmp == str2);
    UTF_test(line, UTF_j8_to_uj32(str1.c_str(), str1.size(), buf, 256) == UTF_SUCCESS);
    UTF_test(line, UTF_uj32_cmpn(tmp.c_str(), buf, UTF_SIZE_T(tmp.size() + 1)) == 0);
}